

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PixelToasterUnix.h
# Opt level: O2

__pid_t __thiscall PixelToaster::UnixTimer::wait(UnixTimer *this,void *__stat_loc)

{
  uint uVar1;
  int *piVar2;
  double in_XMM0_Qa;
  double dVar3;
  timespec timeRemaining;
  timespec local_38;
  timespec local_28;
  
  dVar3 = floor(in_XMM0_Qa);
  local_28.tv_sec = (__time_t)dVar3;
  local_28.tv_nsec = (long)((in_XMM0_Qa - dVar3) * 1000000000.0);
  while( true ) {
    uVar1 = nanosleep(&local_28,&local_38);
    piVar2 = (int *)(ulong)uVar1;
    if (uVar1 != 0xffffffff) break;
    piVar2 = __errno_location();
    if (*piVar2 != 4) break;
    local_28.tv_sec = local_38.tv_sec;
    local_28.tv_nsec = local_38.tv_nsec;
  }
  return (__pid_t)piVar2;
}

Assistant:

void wait(double seconds)
    {
        internal::wait(seconds);
    }